

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O2

void __thiscall QHttpMultiPartIODevice::~QHttpMultiPartIODevice(QHttpMultiPartIODevice *this)

{
  *(undefined ***)this = &PTR_metaObject_002cd2c0;
  QArrayDataPointer<long_long>::~QArrayDataPointer(&(this->partOffsets).d);
  QIODevice::~QIODevice(&this->super_QIODevice);
  return;
}

Assistant:

QHttpMultiPartIODevice::~QHttpMultiPartIODevice()
    = default;